

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_3::containsSubType
               (VarType *complexType,DataType basicType)

{
  bool bVar1;
  DataType DVar2;
  int iVar3;
  StructType *pSVar4;
  StructMember *this;
  VarType *pVVar5;
  int local_20;
  int ndx;
  DataType basicType_local;
  VarType *complexType_local;
  
  bVar1 = glu::VarType::isBasicType(complexType);
  if (bVar1) {
    DVar2 = glu::VarType::getBasicType(complexType);
    complexType_local._7_1_ = DVar2 == basicType;
  }
  else {
    bVar1 = glu::VarType::isArrayType(complexType);
    if (bVar1) {
      pVVar5 = glu::VarType::getElementType(complexType);
      complexType_local._7_1_ = containsSubType(pVVar5,basicType);
    }
    else {
      bVar1 = glu::VarType::isStructType(complexType);
      if (bVar1) {
        local_20 = 0;
        while( true ) {
          pSVar4 = glu::VarType::getStructPtr(complexType);
          iVar3 = glu::StructType::getNumMembers(pSVar4);
          if (iVar3 <= local_20) break;
          pSVar4 = glu::VarType::getStructPtr(complexType);
          this = glu::StructType::getMember(pSVar4,local_20);
          pVVar5 = glu::StructMember::getType(this);
          bVar1 = containsSubType(pVVar5,basicType);
          if (bVar1) {
            return true;
          }
          local_20 = local_20 + 1;
        }
        complexType_local._7_1_ = false;
      }
      else {
        complexType_local._7_1_ = false;
      }
    }
  }
  return complexType_local._7_1_;
}

Assistant:

static bool containsSubType (const glu::VarType& complexType, glu::DataType basicType)
{
	if (complexType.isBasicType())
	{
		return complexType.getBasicType() == basicType;
	}
	else if (complexType.isArrayType())
	{
		return containsSubType(complexType.getElementType(), basicType);
	}
	else if (complexType.isStructType())
	{
		for (int ndx = 0; ndx < complexType.getStructPtr()->getNumMembers(); ++ndx)
			if (containsSubType(complexType.getStructPtr()->getMember(ndx).getType(), basicType))
				return true;
		return false;
	}
	else
	{
		DE_ASSERT(false);
		return false;
	}
}